

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_pri_tet_cap_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  REF_INT RVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  int local_94 [25];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x28a
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"create");
    return uVar4;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar8 = 0;
  iVar5 = (int)(6 / (long)iVar6);
  iVar11 = iVar5 * iVar6;
  if (6 < iVar11) {
    iVar8 = ((((iVar6 + 6) / iVar6) * (iVar11 + -7)) / iVar5 - iVar11) + 7;
  }
  if (iVar7 == iVar8) {
LAB_00126cda:
    uVar4 = ref_node_add(ref_node,0,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a0,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local_a8;
    pRVar3 = pRVar2 + lVar12 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_node_add(ref_node,1,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a1,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_a4;
    pRVar3[lVar12 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar12 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_node_add(ref_node,2,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a2,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_a0;
    pRVar3[lVar12 * 0xf] = 0.0;
    pRVar3[lVar12 * 0xf + 1] = 1.0;
    pRVar3[lVar12 * 0xf + 2] = 0.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_node_add(ref_node,3,&local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a3,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local_9c;
    pRVar3 = pRVar2 + lVar12 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar12 * 0xf + 2] = 1.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_9c < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_node_add(ref_node,4,&local_98);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a4,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_98;
    pRVar3[lVar12 * 0xf] = 1.0;
    pRVar3[lVar12 * 0xf + 1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_node_add(ref_node,5,local_94);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a5,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_94[0];
    pRVar3[lVar12 * 0xf] = 0.0;
    pRVar3[lVar12 * 0xf + 1] = 1.0;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_94[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_cell_add(pRVar1->cell[10],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2a7,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add prism");
      return uVar4;
    }
  }
  else {
    iVar6 = (iVar6 + 6) / iVar6;
    iVar8 = 0;
    if (iVar6 + 1U < 3) {
      iVar8 = iVar6;
    }
    iVar11 = 7 - iVar11;
    if (iVar11 <= iVar8) {
      iVar8 = (1 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar8) goto LAB_00126cda;
    iVar8 = (int)(2 / (long)iVar6);
    if (iVar11 <= iVar8) {
      iVar8 = (2 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar8) goto LAB_00126cda;
    iVar8 = (int)(3 / (long)iVar6);
    if (iVar11 <= iVar8) {
      iVar8 = (3 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar8) goto LAB_00126cda;
    iVar8 = (int)(4 / (long)iVar6);
    if (iVar11 <= iVar8) {
      iVar8 = (4 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar8) goto LAB_00126cda;
    iVar8 = (int)(5 / (long)iVar6);
    if (iVar11 <= iVar8) {
      iVar8 = (5 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar8) goto LAB_00126cda;
  }
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar8 = (iVar6 + 6) / iVar6;
  iVar11 = (int)(3 / (long)iVar8);
  iVar5 = (int)(6 / (long)iVar6);
  iVar6 = 7 - iVar5 * iVar6;
  if (iVar6 <= iVar11) {
    iVar11 = (3 - iVar6 * iVar8) / iVar5 + iVar6;
  }
  if (iVar7 == iVar11) {
LAB_00127557:
    uVar4 = ref_node_add(ref_node,3,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2b6,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local_a8;
    pRVar3 = pRVar2 + lVar12 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar12 * 0xf + 2] = 1.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_node_add(ref_node,4,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2b7,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_a4;
    pRVar3[lVar12 * 0xf] = 1.0;
    pRVar3[lVar12 * 0xf + 1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_node_add(ref_node,5,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2b8,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_a0;
    pRVar3[lVar12 * 0xf] = 0.0;
    pRVar3[lVar12 * 0xf + 1] = 1.0;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_node_add(ref_node,6,&local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2b9,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_9c;
    pRVar3[lVar12 * 0xf] = 0.3;
    pRVar3[lVar12 * 0xf + 1] = 0.3;
    pRVar3[lVar12 * 0xf + 2] = 2.0;
    lVar10 = -1;
    if (((-1 < lVar12) && (local_9c < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar10 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar10 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar10 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar10 / (long)iVar7);
    }
    else {
      lVar10 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar10 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar10 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar9 = iVar6 + (int)((lVar10 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar9;
    uVar4 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",699
             ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add prism");
      return uVar4;
    }
  }
  else {
    iVar11 = (int)(4 / (long)iVar8);
    if (iVar6 <= iVar11) {
      iVar11 = (4 - iVar6 * iVar8) / iVar5 + iVar6;
    }
    if (iVar7 == iVar11) goto LAB_00127557;
    iVar11 = (int)(5 / (long)iVar8);
    if (iVar6 <= iVar11) {
      iVar11 = (5 - iVar6 * iVar8) / iVar5 + iVar6;
    }
    if (iVar7 == iVar11) goto LAB_00127557;
    iVar11 = (int)(6 / (long)iVar8);
    if (iVar6 <= iVar11) {
      iVar11 = (6 - iVar8 * iVar6) / iVar5 + iVar6;
    }
    if (iVar7 == iVar11) goto LAB_00127557;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,7);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2be
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"init glob");
    return uVar4;
  }
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar8 = 0;
  iVar5 = (int)(6 / (long)iVar6);
  iVar11 = iVar5 * iVar6;
  if (6 < iVar11) {
    iVar8 = ((((iVar6 + 6) / iVar6) * (iVar11 + -7)) / iVar5 - iVar11) + 7;
  }
  if (iVar7 == iVar8) {
LAB_00127bc1:
    uVar4 = ref_node_local(ref_node,0,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2cd,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
      return uVar4;
    }
    uVar4 = ref_node_local(ref_node,3,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2ce,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
      return uVar4;
    }
    uVar4 = ref_node_local(ref_node,4,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2cf,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
      return uVar4;
    }
    uVar4 = ref_node_local(ref_node,1,&local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2d0,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
      return uVar4;
    }
    local_98 = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2d2,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
  }
  else {
    iVar6 = (iVar6 + 6) / iVar6;
    iVar8 = (int)(3 / (long)iVar6);
    iVar11 = 7 - iVar11;
    if (iVar11 <= iVar8) {
      iVar8 = (3 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar8) goto LAB_00127bc1;
    iVar8 = (int)(4 / (long)iVar6);
    if (iVar11 <= iVar8) {
      iVar8 = (4 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar8) goto LAB_00127bc1;
    iVar8 = 0;
    if (iVar6 + 1U < 3) {
      iVar8 = iVar6;
    }
    if (iVar11 <= iVar8) {
      iVar8 = (1 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar8) goto LAB_00127bc1;
  }
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar8 = (iVar6 + 6) / iVar6;
  iVar11 = (int)(3 / (long)iVar8);
  iVar5 = (int)(6 / (long)iVar6);
  iVar6 = 7 - iVar5 * iVar6;
  if (iVar6 <= iVar11) {
    iVar11 = (3 - iVar6 * iVar8) / iVar5 + iVar6;
  }
  if (iVar7 != iVar11) {
    iVar11 = (int)(5 / (long)iVar8);
    if (iVar6 <= iVar11) {
      iVar11 = (5 - iVar6 * iVar8) / iVar5 + iVar6;
    }
    if (iVar7 != iVar11) {
      iVar11 = (int)(4 / (long)iVar8);
      if (iVar6 <= iVar11) {
        iVar11 = (4 - iVar8 * iVar6) / iVar5 + iVar6;
      }
      if (iVar7 != iVar11) goto LAB_00127f4a;
    }
  }
  uVar4 = ref_node_local(ref_node,3,&local_a8);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2df
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
    return uVar4;
  }
  uVar4 = ref_node_local(ref_node,5,&local_a4);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2e0
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
    return uVar4;
  }
  uVar4 = ref_node_local(ref_node,4,&local_a0);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2e1
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
    return uVar4;
  }
  local_9c = 100;
  uVar4 = ref_cell_add(pRVar1->cell[3],&local_a8,&local_ac);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2e3
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add tri");
    return uVar4;
  }
LAB_00127f4a:
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar8 = 0;
  iVar5 = (int)(6 / (long)iVar6);
  iVar11 = iVar5 * iVar6;
  if (6 < iVar11) {
    iVar8 = ((((iVar6 + 6) / iVar6) * (iVar11 + -7)) / iVar5 - iVar11) + 7;
  }
  if (iVar7 != iVar8) {
    iVar6 = (iVar6 + 6) / iVar6;
    iVar8 = 0;
    if (iVar6 + 1U < 3) {
      iVar8 = iVar6;
    }
    iVar11 = 7 - iVar11;
    if (iVar11 <= iVar8) {
      iVar8 = (1 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 != iVar8) {
      iVar8 = (int)(2 / (long)iVar6);
      if (iVar11 <= iVar8) {
        iVar8 = (2 - iVar6 * iVar11) / iVar5 + iVar11;
      }
      if (iVar7 != iVar8) {
        return 0;
      }
    }
  }
  uVar4 = ref_node_local(ref_node,0,&local_a8);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2f0
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
    return uVar4;
  }
  uVar4 = ref_node_local(ref_node,1,&local_a4);
  if (uVar4 == 0) {
    uVar4 = ref_node_local(ref_node,2,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x2f2,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
      return uVar4;
    }
    local_9c = 0x65;
    uVar4 = ref_cell_add(pRVar1->cell[3],&local_a8,&local_ac);
    if (uVar4 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2f4
           ,"ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"add tri");
    return uVar4;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x2f1,
         "ref_fixture_pri_tet_cap_grid",(ulong)uVar4,"loc");
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_tet_cap_grid(REF_GRID *ref_grid_ptr,
                                                REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 7;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 1.0, 0.0, 1.0);
    add_that_node(5, 0.0, 1.0, 1.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 1.0);
    add_that_node(1, 1.0, 0.0, 1.0);
    add_that_node(2, 0.0, 1.0, 1.0);
    add_that_node(3, 0.3, 0.3, 2.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 3;
  global[2] = 4;
  global[3] = 1;
  global[4] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 3;
  global[1] = 5;
  global[2] = 4;
  global[3] = 100;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  return REF_SUCCESS;
}